

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SetString
          (Reflection *this,Message *message,FieldDescriptor *field,string *value)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Type TVar4;
  Descriptor *pDVar5;
  InlinedStringField *pIVar6;
  ArenaStringPtr *pAVar7;
  Arena *arena;
  OneofDescriptor *pOVar8;
  string *psVar9;
  string *in_RCX;
  FieldDescriptor *in_RDX;
  string *in_RSI;
  Message *in_RDI;
  Descriptor *unaff_retaddr;
  string *default_ptr;
  FieldDescriptor *in_stack_ffffffffffffff48;
  Reflection *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  Message *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  string local_58 [40];
  FieldDescriptor *local_30;
  Message *method;
  FieldDescriptor *in_stack_ffffffffffffffe8;
  CppType expected_type;
  Descriptor *in_stack_fffffffffffffff0;
  FieldDescriptor *in_stack_fffffffffffffff8;
  
  local_30 = in_RDX;
  method = in_RDI;
  pDVar5 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar5 != (Descriptor *)(in_RDI->super_MessageLite)._vptr_MessageLite) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(char *)method,(char *)in_RSI);
  }
  LVar2 = FieldDescriptor::label(local_30);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(char *)method,(char *)in_RSI);
  }
  expected_type = (CppType)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x414e85);
  if (CVar3 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (unaff_retaddr,in_stack_fffffffffffffff8,(char *)in_stack_fffffffffffffff0,
               expected_type);
  }
  bVar1 = FieldDescriptor::is_extension(local_30);
  if (bVar1) {
    MutableExtensionSet(in_stack_ffffffffffffff50,(Message *)in_stack_ffffffffffffff48);
    FieldDescriptor::number(local_30);
    TVar4 = FieldDescriptor::type
                      ((FieldDescriptor *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    std::__cxx11::string::string(local_58,in_RCX);
    internal::ExtensionSet::SetString
              ((ExtensionSet *)CONCAT44(TVar4,in_stack_ffffffffffffff60),
               (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
               (FieldType)((ulong)in_stack_ffffffffffffff58 >> 0x18),
               (string *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_58);
  }
  else {
    FieldDescriptor::options(local_30);
    FieldOptions::ctype((FieldOptions *)0x414f73);
    bVar1 = IsInlined(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (bVar1) {
      pIVar6 = MutableField<google::protobuf::internal::InlinedStringField>
                         ((Reflection *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          (Message *)in_stack_ffffffffffffff58,
                          (FieldDescriptor *)in_stack_ffffffffffffff50);
      std::__cxx11::string::assign((string *)pIVar6);
    }
    else {
      pAVar7 = DefaultRaw<google::protobuf::internal::ArenaStringPtr>
                         (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      arena = (Arena *)internal::ArenaStringPtr::Get_abi_cxx11_(pAVar7);
      pOVar8 = FieldDescriptor::containing_oneof(local_30);
      if ((pOVar8 != (OneofDescriptor *)0x0) &&
         (bVar1 = HasOneofField((Reflection *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff68,
                                (FieldDescriptor *)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)),
         !bVar1)) {
        FieldDescriptor::containing_oneof(local_30);
        ClearOneof((Reflection *)arena,in_RDI,(OneofDescriptor *)in_RCX);
        pAVar7 = MutableField<google::protobuf::internal::ArenaStringPtr>
                           ((Reflection *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (Message *)in_RSI,(FieldDescriptor *)in_stack_ffffffffffffff50);
        internal::ArenaStringPtr::UnsafeSetDefault(pAVar7,(string *)arena);
        in_stack_ffffffffffffff58 = in_RSI;
      }
      pAVar7 = MutableField<google::protobuf::internal::ArenaStringPtr>
                         ((Reflection *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          (Message *)in_stack_ffffffffffffff58,
                          (FieldDescriptor *)in_stack_ffffffffffffff50);
      GetArena((Reflection *)arena,(Message *)pAVar7);
      psVar9 = internal::ArenaStringPtr::Mutable
                         ((ArenaStringPtr *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff58,arena);
      std::__cxx11::string::assign((string *)psVar9);
    }
  }
  return;
}

Assistant:

void Reflection::SetString(Message* message, const FieldDescriptor* field,
                           std::string value) const {
  USAGE_CHECK_ALL(SetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return MutableExtensionSet(message)->SetString(field->number(),
                                                   field->type(), std::move(value), field);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        if (IsInlined(field)) {
          MutableField<InlinedStringField>(message, field)
              ->SetNoArena(nullptr, std::move(value));
          break;
        }

        const std::string* default_ptr =
            &DefaultRaw<ArenaStringPtr>(field).Get();
        if (field->containing_oneof() && !HasOneofField(*message, field)) {
          ClearOneof(message, field->containing_oneof());
          MutableField<ArenaStringPtr>(message, field)
              ->UnsafeSetDefault(default_ptr);
        }
        MutableField<ArenaStringPtr>(message, field)
            ->Mutable(default_ptr, GetArena(message))->assign(std::move(value));
        break;
      }
    }
  }
}